

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O3

static_metric_manager<test_id_t<9UL>_> *
ylt::metric::static_metric_manager<test_id_t<9UL>_>::instance(void)

{
  int iVar1;
  
  if (static_metric_manager<test_id_t<9ul>>::instance()::inst == '\0') {
    iVar1 = __cxa_guard_acquire(&static_metric_manager<test_id_t<9ul>>::instance()::inst);
    if (iVar1 != 0) {
      instance::inst = (static_metric_manager<test_id_t<9UL>_> *)operator_new(0x38);
      *(undefined8 *)&(instance::inst->metric_map_)._M_h._M_rehash_policy = 0;
      (instance::inst->metric_map_)._M_h._M_rehash_policy._M_next_resize = 0;
      (instance::inst->metric_map_)._M_h._M_buckets =
           &(instance::inst->metric_map_)._M_h._M_single_bucket;
      (instance::inst->metric_map_)._M_h._M_bucket_count = 1;
      (instance::inst->metric_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (instance::inst->metric_map_)._M_h._M_element_count = 0;
      (instance::inst->metric_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (instance::inst->metric_map_)._M_h._M_rehash_policy._M_next_resize = 0;
      (instance::inst->metric_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      __cxa_guard_release(&static_metric_manager<test_id_t<9ul>>::instance()::inst);
    }
  }
  return instance::inst;
}

Assistant:

static static_metric_manager<Tag>& instance() {
    static auto* inst = new static_metric_manager<Tag>();
    return *inst;
  }